

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objCopy(void *dest,void *src)

{
  void *in_RSI;
  void *in_stack_ffffffffffffffe8;
  
  memMove(in_RSI,in_stack_ffffffffffffffe8,0x1724f5);
  objShiftPtrs(in_RSI,(ptrdiff_t)in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void objCopy(void* dest, const void* src)
{
	ASSERT(objIsOperable(src));
	ASSERT(memIsValid(dest, objKeep(src)));
	// скопировать данные
	memMove(dest, src, objKeep(src));
	// сдвинуть указатели
	objShiftPtrs(dest, (const octet*)dest - (const octet*)src);
}